

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

void __thiscall QHttpNetworkConnectionChannel::_q_connected(QHttpNetworkConnectionChannel *this)

{
  QAbstractSocket *pQVar1;
  QLocalSocket *pQVar2;
  QHttpNetworkConnectionChannel *in_RDI;
  QLocalSocket *s_1;
  QAbstractSocket *s;
  QAbstractSocket *in_stack_00000050;
  QHttpNetworkConnectionChannel *in_stack_00000058;
  QLocalSocket *in_stack_ffffffffffffffd8;
  
  pQVar1 = qobject_cast<QAbstractSocket*>((QObject *)0x2fbf70);
  if (pQVar1 == (QAbstractSocket *)0x0) {
    pQVar2 = qobject_cast<QLocalSocket*>((QObject *)0x2fbf9c);
    if (pQVar2 != (QLocalSocket *)0x0) {
      _q_connected_local_socket(in_RDI,in_stack_ffffffffffffffd8);
    }
  }
  else {
    _q_connected_abstract_socket(in_stack_00000058,in_stack_00000050);
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::_q_connected()
{
    if (auto *s = qobject_cast<QAbstractSocket *>(socket))
        _q_connected_abstract_socket(s);
#if QT_CONFIG(localserver)
    else if (auto *s = qobject_cast<QLocalSocket *>(socket))
        _q_connected_local_socket(s);
#endif
}